

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrConditionalWrapper.cpp
# Opt level: O2

Statement * __thiscall
IRT::OrConditionalWrapper::ToConditional
          (OrConditionalWrapper *this,Label *true_label,Label *false_label)

{
  SubtreeWrapper *pSVar1;
  int iVar2;
  SeqStatement *this_00;
  undefined4 extraout_var;
  SeqStatement *this_01;
  LabelStatement *this_02;
  undefined4 extraout_var_00;
  string local_110 [32];
  string local_f0 [32];
  Label local_d0;
  string local_b0 [32];
  string local_90 [32];
  undefined1 local_70 [8];
  Label middle_label;
  
  Label::Label((Label *)local_70);
  this_00 = (SeqStatement *)operator_new(0x18);
  pSVar1 = this->first_;
  std::__cxx11::string::string(local_110,(string *)true_label);
  std::__cxx11::string::string(local_f0,(string *)local_70);
  iVar2 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,local_110,local_f0);
  this_01 = (SeqStatement *)operator_new(0x18);
  this_02 = (LabelStatement *)operator_new(0x28);
  middle_label.label_.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::string((string *)&local_d0,(string *)local_70);
  LabelStatement::LabelStatement(this_02,&local_d0);
  pSVar1 = this->second_;
  std::__cxx11::string::string(local_b0,(string *)true_label);
  std::__cxx11::string::string(local_90,(string *)false_label);
  iVar2 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,local_b0,local_90);
  SeqStatement::SeqStatement
            (this_01,(Statement *)this_02,(Statement *)CONCAT44(extraout_var_00,iVar2));
  SeqStatement::SeqStatement
            (this_00,(Statement *)middle_label.label_.field_2._8_8_,(Statement *)this_01);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_70);
  return &this_00->super_Statement;
}

Assistant:

Statement *OrConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    Label middle_label;
    return new SeqStatement(
        first_->ToConditional(true_label, middle_label),
        new SeqStatement(
            new LabelStatement(middle_label),
            second_->ToConditional(true_label, false_label)
        )
    );
}